

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_inflate.c
# Opt level: O2

REF_STATUS
ref_inflate_face(REF_GRID ref_grid,REF_DICT faceids,REF_DBL *origin,REF_DBL thickness,REF_DBL xshift
                )

{
  double *pdVar1;
  size_t __size;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  int node1;
  int iVar7;
  REF_MPI ref_mpi;
  REF_CELL pRVar8;
  REF_CELL ref_cell;
  REF_DBL *pRVar9;
  REF_ADJ pRVar10;
  undefined1 auVar11 [16];
  REF_STATUS RVar12;
  REF_BOOL RVar13;
  uint uVar14;
  int iVar15;
  void *pvVar16;
  void *__ptr;
  void *pvVar17;
  long lVar18;
  void *__ptr_00;
  long lVar19;
  REF_GLOB *vector;
  REF_ADJ_ITEM pRVar20;
  ulong uVar21;
  undefined8 uVar22;
  ulong uVar23;
  long lVar24;
  REF_INT cell;
  char *pcVar25;
  int iVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uStackY_2b0;
  int local_294;
  REF_NODE local_290;
  REF_CELL local_288;
  REF_DICT local_280;
  REF_INT new_node;
  void *local_270;
  REF_DBL *local_268;
  REF_INT new_cell;
  void *local_258;
  REF_INT tris [2];
  REF_DBL local_238;
  undefined1 local_230 [24];
  void *local_218;
  REF_DBL temp;
  REF_DBL y1;
  REF_DBL y0;
  void *local_1f8;
  undefined8 uStack_1f0;
  ulong local_1e0;
  REF_CELL local_1d8;
  REF_DBL local_1d0;
  REF_INT nquad;
  REF_INT ntri;
  REF_GRID local_1c0;
  REF_INT nodes [27];
  REF_DBL min_dot;
  REF_GLOB global;
  REF_INT quads [2];
  REF_INT new_nodes [27];
  REF_INT ref_nodes [27];
  
  uVar23 = (ulong)(uint)faceids->n;
  local_280 = faceids;
  local_268 = origin;
  if (faceids->n < 0) {
    RVar12 = 1;
    pcVar25 = "malloc face_normal of REF_DBL negative";
  }
  else {
    ref_mpi = ref_grid->mpi;
    local_290 = ref_grid->node;
    local_288 = ref_grid->cell[3];
    pRVar8 = ref_grid->cell[6];
    ref_cell = ref_grid->cell[10];
    local_1d0 = xshift;
    local_258 = malloc(uVar23 * 0x18);
    RVar12 = 2;
    if (local_258 != (void *)0x0) {
      for (uVar21 = 0; (uVar23 * 3 & 0xffffffff) != uVar21; uVar21 = uVar21 + 1) {
        *(undefined8 *)((long)local_258 + uVar21 * 8) = 0xbff0000000000000;
      }
      __size = uVar23 * 8;
      pvVar16 = malloc(__size);
      if (pvVar16 == (void *)0x0) {
        pcVar25 = "malloc ymin of REF_DBL NULL";
        uStackY_2b0 = 0x77;
      }
      else {
        for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
          *(undefined8 *)((long)pvVar16 + uVar21 * 8) = 0x6974e718d7d7625a;
        }
        local_1d8 = pRVar8;
        __ptr = malloc(__size);
        if (__ptr == (void *)0x0) {
          pcVar25 = "malloc ymax of REF_DBL NULL";
          uStackY_2b0 = 0x78;
        }
        else {
          for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
            *(undefined8 *)((long)__ptr + uVar21 * 8) = 0xe974e718d7d7625a;
          }
          local_1c0 = ref_grid;
          pvVar17 = malloc(__size);
          if (pvVar17 != (void *)0x0) {
            for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
              *(undefined8 *)((long)pvVar17 + uVar21 * 8) = 0x3ff0000000000000;
            }
            y0 = 1e+200;
            y1 = -1e+200;
            local_1f8 = pvVar17;
            for (iVar26 = 0; iVar26 < local_288->max; iVar26 = iVar26 + 1) {
              RVar12 = ref_cell_nodes(local_288,iVar26,nodes);
              if ((RVar12 == 0) && (RVar13 = ref_dict_has_key(local_280,nodes[3]), RVar13 != 0)) {
                for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
                  uVar14 = ref_dict_location(local_280,nodes[3],&local_294);
                  if (uVar14 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                           ,0x80,"ref_inflate_face",(ulong)uVar14,"key loc");
                    return uVar14;
                  }
                  dVar27 = local_290->real[(long)nodes[lVar24] * 0xf + 1] - local_268[1];
                  lVar18 = (long)local_294;
                  if (dVar27 < *(double *)((long)pvVar16 + lVar18 * 8)) {
                    *(double *)((long)pvVar16 + lVar18 * 8) = dVar27;
                  }
                  pdVar1 = (double *)((long)__ptr + lVar18 * 8);
                  if (*pdVar1 <= dVar27 && dVar27 != *pdVar1) {
                    *(double *)((long)__ptr + lVar18 * 8) = dVar27;
                  }
                  if (dVar27 < y0) {
                    y0 = dVar27;
                  }
                  if (y1 < dVar27) {
                    y1 = dVar27;
                  }
                }
              }
            }
            temp = y0;
            uVar14 = ref_mpi_min(ref_mpi,&temp,&y0,3);
            if (uVar14 == 0) {
              uVar14 = ref_mpi_bcast(ref_mpi,&y0,1,3);
              if (uVar14 == 0) {
                temp = y1;
                uVar14 = ref_mpi_max(ref_mpi,&temp,&y1,3);
                if (uVar14 == 0) {
                  uVar14 = ref_mpi_bcast(ref_mpi,&y1,1,3);
                  if (uVar14 == 0) {
                    local_294 = 0;
                    while( true ) {
                      uVar14 = local_280->n;
                      uVar23 = (ulong)uVar14;
                      if ((int)uVar14 <= local_294) break;
                      temp = *(REF_DBL *)((long)pvVar16 + (long)local_294 * 8);
                      uVar14 = ref_mpi_min(ref_mpi,&temp,
                                           (void *)((long)local_294 * 8 + (long)pvVar16),3);
                      if (uVar14 != 0) {
                        uVar23 = (ulong)uVar14;
                        pcVar25 = "max thresh";
                        uVar22 = 0x9c;
                        goto LAB_00186213;
                      }
                      uVar14 = ref_mpi_bcast(ref_mpi,(void *)((long)local_294 * 8 + (long)pvVar16),1
                                             ,3);
                      if (uVar14 != 0) {
                        uVar23 = (ulong)uVar14;
                        pcVar25 = "bcast";
                        uVar22 = 0x9d;
                        goto LAB_00186213;
                      }
                      temp = *(REF_DBL *)((long)__ptr + (long)local_294 * 8);
                      uVar14 = ref_mpi_max(ref_mpi,&temp,(void *)((long)__ptr + (long)local_294 * 8)
                                           ,3);
                      if (uVar14 != 0) {
                        uVar23 = (ulong)uVar14;
                        pcVar25 = "max thresh";
                        uVar22 = 0x9f;
                        goto LAB_00186213;
                      }
                      uVar14 = ref_mpi_bcast(ref_mpi,(void *)((long)__ptr + (long)local_294 * 8),1,3
                                            );
                      if (uVar14 != 0) {
                        uVar23 = (ulong)uVar14;
                        pcVar25 = "bcast";
                        uVar22 = 0xa0;
                        goto LAB_00186213;
                      }
                      lVar24 = (long)local_294;
                      *(undefined8 *)((long)local_1f8 + lVar24 * 8) =
                           *(undefined8 *)
                            (&DAT_00222d60 +
                            (ulong)(*(double *)((long)pvVar16 + lVar24 * 8) - y0 <
                                   y1 - *(double *)((long)__ptr + lVar24 * 8)) * 8);
                      local_294 = local_294 + 1;
                    }
                    if ((int)uVar14 < 0) {
                      pcVar25 = "malloc tmin of REF_DBL negative";
                      uVar22 = 0xa9;
                      goto LAB_0018647a;
                    }
                    pvVar17 = malloc(uVar23 * 8);
                    if (pvVar17 == (void *)0x0) {
                      pcVar25 = "malloc tmin of REF_DBL NULL";
                      uStackY_2b0 = 0xa9;
                    }
                    else {
                      for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
                        *(undefined8 *)((long)pvVar17 + uVar21 * 8) = 0x402921fb54442d11;
                      }
                      __ptr_00 = malloc(uVar23 * 8);
                      if (__ptr_00 == (void *)0x0) {
                        pcVar25 = "malloc tmax of REF_DBL NULL";
                        uStackY_2b0 = 0xaa;
                      }
                      else {
                        for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
                          *(undefined8 *)((long)__ptr_00 + uVar21 * 8) = 0xc02921fb54442d11;
                        }
                        local_270 = malloc(uVar23 * 4);
                        if (local_270 == (void *)0x0) {
                          pcVar25 = "malloc imin of REF_INT NULL";
                          uStackY_2b0 = 0xab;
                        }
                        else {
                          for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
                            *(undefined4 *)((long)local_270 + uVar21 * 4) = 0xffffffff;
                          }
                          local_218 = malloc(uVar23 * 4);
                          if (local_218 == (void *)0x0) {
                            pcVar25 = "malloc imax of REF_INT NULL";
                            uStackY_2b0 = 0xac;
                          }
                          else {
                            for (uVar21 = 0; uVar23 != uVar21; uVar21 = uVar21 + 1) {
                              *(undefined4 *)((long)local_218 + uVar21 * 4) = 0xffffffff;
                            }
                            for (local_1e0 = 0; (int)local_1e0 < local_288->max;
                                local_1e0 = (ulong)((int)local_1e0 + 1)) {
                              RVar12 = ref_cell_nodes(local_288,(int)local_1e0,nodes);
                              if ((RVar12 == 0) &&
                                 (RVar13 = ref_dict_has_key(local_280,nodes[3]), RVar13 != 0)) {
                                for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
                                  uVar14 = ref_dict_location(local_280,nodes[3],&local_294);
                                  if (uVar14 != 0) {
                                    uVar23 = (ulong)uVar14;
                                    pcVar25 = "key loc";
                                    uVar22 = 0xb1;
                                    goto LAB_00186213;
                                  }
                                  iVar26 = nodes[lVar24];
                                  dVar27 = atan2(local_290->real[(long)iVar26 * 0xf + 2] -
                                                 local_268[2],
                                                 (local_290->real[(long)iVar26 * 0xf + 1] -
                                                 local_268[1]) *
                                                 *(double *)((long)local_1f8 + (long)local_294 * 8))
                                  ;
                                  lVar18 = (long)local_294;
                                  if (dVar27 < *(double *)((long)pvVar17 + lVar18 * 8)) {
                                    *(double *)((long)pvVar17 + lVar18 * 8) = dVar27;
                                    *(int *)((long)local_270 + lVar18 * 4) = iVar26;
                                  }
                                  pdVar1 = (double *)((long)__ptr_00 + lVar18 * 8);
                                  if (*pdVar1 <= dVar27 && dVar27 != *pdVar1) {
                                    *(double *)((long)__ptr_00 + lVar18 * 8) = dVar27;
                                    *(int *)((long)local_218 + lVar18 * 4) = iVar26;
                                  }
                                }
                              }
                            }
                            for (local_294 = 0; local_294 < local_280->n; local_294 = local_294 + 1)
                            {
                              lVar24 = (long)local_294;
                              iVar26 = *(int *)((long)local_270 + lVar24 * 4);
                              if (ref_mpi->n < 2) {
                                if (iVar26 == -1) {
                                  pcVar25 = "imin";
                                  uVar22 = 199;
LAB_001868a2:
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                         ,uVar22,"ref_inflate_face",pcVar25);
                                  printf("empty %d: %d \n",(long)local_294,
                                         (ulong)(uint)local_280->key[local_294]);
                                  return 1;
                                }
                                if (*(int *)((long)local_218 + lVar24 * 4) == -1) {
                                  pcVar25 = "imax";
                                  uVar22 = 0xc9;
                                  goto LAB_001868a2;
                                }
LAB_00186711:
                                lVar18 = (long)*(int *)((long)local_218 + lVar24 * 4);
                                if (lVar18 != -1) {
                                  lVar19 = (long)(local_294 * 3);
                                  *(undefined8 *)((long)local_258 + lVar19 * 8) = 0;
                                  pRVar9 = local_290->real;
                                  dVar27 = pRVar9[lVar18 * 0xf + 2];
                                  dVar2 = *(double *)((long)local_1f8 + lVar24 * 8);
                                  dVar3 = pRVar9[(long)iVar26 * 0xf + 2];
                                  *(double *)((long)local_258 + lVar19 * 8 + 8) = dVar27 - dVar3;
                                  dVar4 = pRVar9[lVar18 * 0xf + 1];
                                  dVar5 = pRVar9[(long)iVar26 * 0xf + 1];
                                  pdVar1 = (double *)((long)local_258 + lVar19 * 8 + 8);
                                  *pdVar1 = -dVar2 * (dVar27 - dVar3);
                                  pdVar1[1] = dVar2 * (dVar4 - dVar5);
                                  uVar14 = ref_math_normalize((REF_DBL *)
                                                              ((long)local_258 + lVar19 * 8));
                                  if (uVar14 != 0) {
                                    uVar23 = (ulong)uVar14;
                                    pcVar25 = "make face norm";
                                    uVar22 = 0xd6;
                                    goto LAB_00186213;
                                  }
                                }
                              }
                              else if (iVar26 != -1) goto LAB_00186711;
                            }
                            free(local_218);
                            free(local_270);
                            free(__ptr_00);
                            free(pvVar17);
                            free(local_1f8);
                            free(__ptr);
                            free(pvVar16);
                            lVar24 = (long)local_290->max;
                            if (lVar24 < 0) {
                              pcVar25 = "malloc o2n of REF_INT negative";
                              uVar22 = 0xec;
LAB_0018647a:
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                     ,uVar22,"ref_inflate_face",pcVar25);
                              return 1;
                            }
                            pvVar16 = malloc(lVar24 * 4);
                            if (pvVar16 == (void *)0x0) {
                              pcVar25 = "malloc o2n of REF_INT NULL";
                              uStackY_2b0 = 0xec;
                            }
                            else {
                              for (lVar18 = 0; lVar24 != lVar18; lVar18 = lVar18 + 1) {
                                *(undefined4 *)((long)pvVar16 + lVar18 * 4) = 0xffffffff;
                              }
                              for (iVar26 = 0; iVar26 < local_288->max; iVar26 = iVar26 + 1) {
                                RVar12 = ref_cell_nodes(local_288,iVar26,nodes);
                                if ((RVar12 == 0) &&
                                   (RVar13 = ref_dict_has_key(local_280,nodes[3]), RVar13 != 0)) {
                                  for (lVar18 = 0; lVar18 != 3; lVar18 = lVar18 + 1) {
                                    lVar19 = (long)nodes[lVar18];
                                    if ((local_290->ref_mpi->id == local_290->part[lVar19]) &&
                                       (*(int *)((long)pvVar16 + lVar19 * 4) == -1)) {
                                      uVar14 = ref_node_next_global(local_290,&global);
                                      if (uVar14 != 0) {
                                        uVar23 = (ulong)uVar14;
                                        pcVar25 = "global";
                                        uVar22 = 0xf4;
                                        goto LAB_00186a6a;
                                      }
                                      uVar14 = ref_node_add(local_290,global,&new_node);
                                      if (uVar14 != 0) {
                                        uVar23 = (ulong)uVar14;
                                        pcVar25 = "add node";
                                        uVar22 = 0xf5;
                                        goto LAB_00186a6a;
                                      }
                                      local_290->part[new_node] = ref_mpi->id;
                                      *(REF_INT *)((long)pvVar16 + lVar19 * 4) = new_node;
                                    }
                                  }
                                }
                              }
                              uVar14 = ref_node_shift_new_globals(local_290);
                              if (uVar14 != 0) {
                                uVar23 = (ulong)uVar14;
                                pcVar25 = "shift glob";
                                uVar22 = 0xff;
                                goto LAB_00186a6a;
                              }
                              uVar14 = local_290->max;
                              lVar18 = (long)(int)uVar14;
                              if (lVar18 < 0) {
                                pcVar25 = "malloc o2g of REF_GLOB negative";
                                uVar22 = 0x101;
                                goto LAB_0018647a;
                              }
                              vector = (REF_GLOB *)malloc(lVar18 * 8);
                              if (vector != (REF_GLOB *)0x0) {
                                for (lVar19 = 0; lVar18 != lVar19; lVar19 = lVar19 + 1) {
                                  vector[lVar19] = -1;
                                }
                                for (lVar18 = 0; lVar24 != lVar18; lVar18 = lVar18 + 1) {
                                  uVar6 = *(uint *)((long)pvVar16 + lVar18 * 4);
                                  if ((ulong)uVar6 != 0xffffffff) {
                                    lVar19 = -1;
                                    if ((uVar6 < uVar14) &&
                                       (lVar19 = local_290->global[uVar6],
                                       local_290->global[uVar6] < 0)) {
                                      lVar19 = -1;
                                    }
                                    vector[lVar18] = lVar19;
                                  }
                                }
                                uVar14 = ref_node_ghost_glob(local_290,vector,1);
                                if (uVar14 == 0) {
                                  free(pvVar16);
                                  lVar24 = (long)local_290->max;
                                  if (lVar24 < 0) {
                                    printf("%s: %d: %s: %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                           ,0x10d,"ref_inflate_face",
                                           "malloc o2n of REF_INT negative");
                                    return 1;
                                  }
                                  pvVar16 = malloc(lVar24 * 4);
                                  if (pvVar16 == (void *)0x0) {
                                    pcVar25 = "malloc o2n of REF_INT NULL";
                                    uStackY_2b0 = 0x10d;
                                    goto LAB_001860d4;
                                  }
                                  for (lVar18 = 0; lVar24 != lVar18; lVar18 = lVar18 + 1) {
                                    *(undefined4 *)((long)pvVar16 + lVar18 * 4) = 0xffffffff;
                                  }
                                  for (lVar18 = 0; lVar24 != lVar18; lVar18 = lVar18 + 1) {
                                    if (vector[lVar18] != -1) {
                                      uVar14 = ref_node_add(local_290,vector[lVar18],&new_node);
                                      if (uVar14 != 0) {
                                        uVar23 = (ulong)uVar14;
                                        pcVar25 = "add node";
                                        uVar22 = 0x112;
                                        goto LAB_00186a6a;
                                      }
                                      local_290->part[new_node] = local_290->part[lVar18];
                                      *(REF_INT *)((long)pvVar16 + lVar18 * 4) = new_node;
                                    }
                                  }
                                  local_270 = (void *)((ulong)local_270 & 0xffffffff00000000);
                                  for (lVar18 = 0; lVar18 != lVar24; lVar18 = lVar18 + 1) {
                                    if ((((lVar18 < local_290->max) &&
                                         (-1 < local_290->global[lVar18])) &&
                                        (local_290->ref_mpi->id == local_290->part[lVar18])) &&
                                       (iVar26 = *(int *)((long)pvVar16 + lVar18 * 4), iVar26 != -1)
                                       ) {
                                      local_238 = 0.0;
                                      local_230._8_8_ =
                                           local_290->real[lVar18 * 0xf + 2] - local_268[2];
                                      local_230._0_8_ =
                                           local_290->real[lVar18 * 0xf + 1] - local_268[1];
                                      new_node = iVar26;
                                      uVar14 = ref_math_normalize(&local_238);
                                      if (uVar14 == 0) {
                                        pRVar10 = local_288->ref_adj;
                                        if ((pRVar10->nnode <= lVar18) ||
                                           (iVar26 = pRVar10->first[lVar18], iVar26 == -1)) {
                                          iVar26 = -1;
                                          cell = -1;
                                          goto LAB_00186d1a;
                                        }
                                        pRVar20 = pRVar10->item;
                                        do {
                                          cell = pRVar20[iVar26].ref;
LAB_00186d1a:
                                          do {
                                            if (iVar26 == -1) {
                                              pRVar9 = local_290->real;
                                              lVar19 = (long)new_node;
                                              pRVar9[lVar19 * 0xf] =
                                                   pRVar9[lVar18 * 0xf] + local_1d0;
                                              pRVar9[lVar19 * 0xf + 1] =
                                                   (double)local_230._0_8_ * thickness +
                                                   pRVar9[lVar18 * 0xf + 1];
                                              pRVar9[lVar19 * 0xf + 2] =
                                                   (double)local_230._8_8_ * thickness +
                                                   pRVar9[lVar18 * 0xf + 2];
                                              goto LAB_00186f44;
                                            }
                                            uVar14 = ref_cell_nodes(local_288,cell,ref_nodes);
                                            if (uVar14 != 0) {
                                              uVar23 = (ulong)uVar14;
                                              pcVar25 = "cell";
                                              uVar22 = 0x122;
                                              goto LAB_00186a6a;
                                            }
                                            RVar13 = ref_dict_has_key(local_280,ref_nodes[3]);
                                            if (RVar13 != 0) {
                                              uVar14 = ref_dict_location(local_280,ref_nodes[3],
                                                                         &local_294);
                                              if (uVar14 != 0) {
                                                uVar23 = (ulong)uVar14;
                                                pcVar25 = "key loc";
                                                uVar22 = 0x124;
                                                goto LAB_00186a6a;
                                              }
                                              lVar19 = (long)local_294 * 0x18;
                                              if (*(double *)((long)local_258 + lVar19) <= -0.1) {
                                                pcVar25 = "uninitialized face_normal";
                                                uVar22 = 0x126;
                                                goto LAB_0018647a;
                                              }
                                              dVar27 = (double)local_230._8_8_ *
                                                       *(double *)((long)local_258 + lVar19 + 0x10)
                                                       + *(double *)((long)local_258 + lVar19) *
                                                         local_238 +
                                                         *(double *)((long)local_258 + lVar19 + 8) *
                                                         (double)local_230._0_8_;
                                              local_1f8 = (void *)-dVar27;
                                              uStack_1f0 = 0x8000000000000000;
                                              if ((-0.7 < dVar27) || (dVar27 < -1.01)) {
                                                printf("out-of-range dot %.15f at %f %f %f\n");
                                                local_270 = (void *)CONCAT44(local_270._4_4_,1);
                                              }
                                              auVar29._0_8_ = dVar27 * -1e+20;
                                              auVar29._8_8_ = local_230._0_8_;
                                              auVar30._8_8_ = -(double)local_230._0_8_;
                                              auVar30._0_8_ = -auVar29._0_8_;
                                              auVar30 = maxpd(auVar29,auVar30);
                                              if (auVar30._0_8_ <= auVar30._8_8_) {
                                                pcVar25 = "normal[1] /= dot";
                                                uVar22 = 0x136;
LAB_001873f6:
                                                printf("%s: %d: %s: %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,uVar22,"ref_inflate_face",pcVar25);
                                                printf("dot %e\n");
                                                pRVar9 = local_290->real;
                                                printf(" xyz %f %f %f\n",
                                                       pRVar9[lVar18 * 0xf & 0xffffffff],
                                                       pRVar9[lVar18 * 0xf + 1],
                                                       pRVar9[lVar18 * 0xf + 2]);
                                                printf(" norm %f %f %f\n",local_238,local_230._0_8_,
                                                       local_230._8_8_);
                                                lVar24 = (long)local_294 * 0x18;
                                                printf("%d face norm %f %f %f\n",
                                                       *(undefined8 *)((long)local_258 + lVar24),
                                                       *(undefined8 *)((long)local_258 + lVar24 + 8)
                                                       ,*(undefined8 *)
                                                         ((long)local_258 + lVar24 + 0x10));
                                                return 1;
                                              }
                                              dVar27 = (double)local_230._8_8_;
                                              if ((double)local_230._8_8_ <=
                                                  -(double)local_230._8_8_) {
                                                dVar27 = -(double)local_230._8_8_;
                                              }
                                              if (auVar30._0_8_ <= dVar27) {
                                                pcVar25 = "normal[2] /= dot";
                                                uVar22 = 0x13f;
                                                goto LAB_001873f6;
                                              }
                                              auVar28._8_8_ = local_230._8_8_;
                                              auVar28._0_8_ = local_230._0_8_;
                                              auVar11._8_8_ = local_1f8;
                                              auVar11._0_8_ = local_1f8;
                                              local_230._0_16_ = divpd(auVar28,auVar11);
                                            }
                                            pRVar20 = local_288->ref_adj->item;
                                            iVar26 = pRVar20[iVar26].next;
                                            cell = -1;
                                          } while (iVar26 == -1);
                                        } while( true );
                                      }
                                      uVar23 = (ulong)uVar14;
                                      pcVar25 = "make norm";
                                      uVar22 = 0x120;
                                      goto LAB_00186a6a;
                                    }
LAB_00186f44:
                                  }
                                  if ((int)local_270 != 0) {
                                    puts("ERROR: new node normal");
                                  }
                                  uVar14 = ref_node_ghost_real(local_290);
                                  if (uVar14 == 0) {
                                    free(local_258);
                                    for (iVar26 = 0; iVar15 = local_288->max, iVar26 < iVar15;
                                        iVar26 = iVar26 + 1) {
                                      RVar12 = ref_cell_nodes(local_288,iVar26,nodes);
                                      if ((RVar12 == 0) &&
                                         (RVar13 = ref_dict_has_key(local_280,nodes[3]), RVar13 != 0
                                         )) {
                                        local_1d0 = (REF_DBL)(long)iVar26;
                                        for (lVar24 = 0; lVar24 != 3; lVar24 = lVar24 + 1) {
                                          lVar18 = (long)local_288->size_per * (long)local_1d0;
                                          iVar15 = local_288->c2n
                                                   [local_288->e2n[lVar24 * 2] + lVar18];
                                          node1 = local_288->c2n
                                                  [(long)(int)lVar18 +
                                                   (long)local_288->e2n[lVar24 * 2 + 1]];
                                          local_268 = (REF_DBL *)(long)node1;
                                          iVar7 = local_290->ref_mpi->id;
                                          lVar18 = (long)iVar15;
                                          if ((iVar7 == local_290->part[lVar18]) ||
                                             (iVar7 == local_290->part[(long)local_268])) {
                                            uVar14 = ref_cell_list_with2(local_288,iVar15,node1,2,
                                                                         &ntri,tris);
                                            if (uVar14 != 0) {
                                              uVar23 = (ulong)uVar14;
                                              pcVar25 = "bad tri count";
                                              uVar22 = 0x15b;
                                              goto LAB_00186a6a;
                                            }
                                            if (ntri == 1) {
                                              uVar14 = ref_cell_list_with2(local_1d8,iVar15,node1,2,
                                                                           &nquad,quads);
                                              if (uVar14 != 0) {
                                                uVar23 = (ulong)uVar14;
                                                pcVar25 = "bad quad count";
                                                uVar22 = 0x15e;
                                                goto LAB_00186a6a;
                                              }
                                              if ((long)nquad != 1) {
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                                  ,0x15f,"ref_inflate_face","tri without quad",1,
                                                  (long)nquad);
                                                return 1;
                                              }
                                              new_nodes[4] = local_1d8->c2n
                                                             [(long)quads[0] *
                                                              (long)local_1d8->size_per + 4];
                                              new_nodes[2] = *(REF_INT *)
                                                              ((long)pvVar16 + (long)local_268 * 4);
                                              new_nodes[3] = *(REF_INT *)
                                                              ((long)pvVar16 + lVar18 * 4);
                                              new_nodes[0] = iVar15;
                                              new_nodes[1] = node1;
                                              uVar14 = ref_cell_add(local_1d8,new_nodes,&new_cell);
                                              if (uVar14 != 0) {
                                                uVar23 = (ulong)uVar14;
                                                pcVar25 = "qua tri1";
                                                uVar22 = 0x165;
                                                goto LAB_00186a6a;
                                              }
                                            }
                                            else {
                                              RVar13 = ref_dict_has_key(local_280,
                                                                        local_288->c2n
                                                                        [(long)tris[0] *
                                                                         (long)local_288->size_per +
                                                                         3]);
                                              if ((RVar13 == 0) ||
                                                 (RVar13 = ref_dict_has_key(local_280,
                                                                            local_288->c2n
                                                                            [(long)tris[1] *
                                                                             (long)local_288->
                                                                                   size_per + 3]),
                                                 RVar13 != 0)) {
                                                RVar13 = ref_dict_has_key(local_280,
                                                                          local_288->c2n
                                                                          [(long)tris[0] *
                                                                           (long)local_288->size_per
                                                                           + 3]);
                                                if ((RVar13 == 0) &&
                                                   (RVar13 = ref_dict_has_key(local_280,
                                                                              local_288->c2n
                                                                              [(long)tris[1] *
                                                                               (long)local_288->
                                                                                     size_per + 3]),
                                                   RVar13 != 0)) {
                                                  new_nodes[4] = local_288->c2n
                                                                 [(long)tris[0] *
                                                                  (long)local_288->size_per + 3];
                                                  new_nodes[2] = *(REF_INT *)
                                                                  ((long)pvVar16 +
                                                                  (long)local_268 * 4);
                                                  new_nodes[3] = *(REF_INT *)
                                                                  ((long)pvVar16 + lVar18 * 4);
                                                  new_nodes[0] = iVar15;
                                                  new_nodes[1] = node1;
                                                  uVar14 = ref_cell_add(local_1d8,new_nodes,
                                                                        &new_cell);
                                                  if (uVar14 != 0) {
                                                    uVar23 = (ulong)uVar14;
                                                    pcVar25 = "qua tri1";
                                                    uVar22 = 0x179;
                                                    goto LAB_00186a6a;
                                                  }
                                                }
                                              }
                                              else {
                                                new_nodes[4] = local_288->c2n
                                                               [(long)tris[1] *
                                                                (long)local_288->size_per + 3];
                                                new_nodes[2] = *(REF_INT *)
                                                                ((long)pvVar16 + (long)local_268 * 4
                                                                );
                                                new_nodes[3] = *(REF_INT *)
                                                                ((long)pvVar16 + lVar18 * 4);
                                                new_nodes[0] = iVar15;
                                                new_nodes[1] = node1;
                                                uVar14 = ref_cell_add(local_1d8,new_nodes,&new_cell)
                                                ;
                                                if (uVar14 != 0) {
                                                  uVar23 = (ulong)uVar14;
                                                  pcVar25 = "qua tri1";
                                                  uVar22 = 0x16f;
                                                  goto LAB_00186a6a;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                    for (iVar26 = 0; iVar26 < iVar15; iVar26 = iVar26 + 1) {
                                      RVar12 = ref_cell_nodes(local_288,iVar26,nodes);
                                      if ((RVar12 == 0) &&
                                         (RVar13 = ref_dict_has_key(local_280,nodes[3]), RVar13 != 0
                                         )) {
                                        new_nodes[0] = nodes[0];
                                        new_nodes[1] = nodes[2];
                                        new_nodes[2] = nodes[1];
                                        new_nodes[3] = *(REF_INT *)
                                                        ((long)pvVar16 + (long)nodes[0] * 4);
                                        new_nodes[4] = *(REF_INT *)
                                                        ((long)pvVar16 + (long)nodes[2] * 4);
                                        new_nodes[5] = *(REF_INT *)
                                                        ((long)pvVar16 + (long)nodes[1] * 4);
                                        uVar14 = ref_inflate_pri_min_dot
                                                           (local_290,new_nodes,&min_dot);
                                        if (uVar14 != 0) {
                                          uVar23 = (ulong)uVar14;
                                          pcVar25 = "md";
                                          uVar22 = 0x18a;
                                          goto LAB_00186a6a;
                                        }
                                        if (min_dot <= 0.0) {
                                          pRVar9 = local_290->real;
                                          lVar24 = (long)nodes[0];
                                          printf("min_dot %f near %f %f %f\n",min_dot,
                                                 pRVar9[lVar24 * 0xf],pRVar9[lVar24 * 0xf + 1],
                                                 pRVar9[lVar24 * 0xf + 2]);
                                          local_270 = (void *)CONCAT44(local_270._4_4_,1);
                                        }
                                        uVar14 = ref_cell_add(ref_cell,new_nodes,&new_cell);
                                        if (uVar14 != 0) {
                                          uVar23 = (ulong)uVar14;
                                          pcVar25 = "pri";
                                          uVar22 = 0x193;
                                          goto LAB_00186a6a;
                                        }
                                      }
                                      iVar15 = local_288->max;
                                    }
                                    for (iVar26 = 0; iVar26 < iVar15; iVar26 = iVar26 + 1) {
                                      RVar12 = ref_cell_nodes(local_288,iVar26,nodes);
                                      if ((RVar12 == 0) &&
                                         (RVar13 = ref_dict_has_key(local_280,nodes[3]), RVar13 != 0
                                         )) {
                                        nodes[0] = *(REF_INT *)((long)pvVar16 + (long)nodes[0] * 4);
                                        nodes[1] = *(REF_INT *)((long)pvVar16 + (long)nodes[1] * 4);
                                        nodes[2] = *(REF_INT *)((long)pvVar16 + (long)nodes[2] * 4);
                                        uVar14 = ref_cell_replace_whole(local_288,iVar26,nodes);
                                        if (uVar14 != 0) {
                                          uVar23 = (ulong)uVar14;
                                          pcVar25 = "repl";
                                          uVar22 = 0x19c;
                                          goto LAB_00186a6a;
                                        }
                                      }
                                      iVar15 = local_288->max;
                                    }
                                    free(vector);
                                    free(pvVar16);
                                    uVar14 = ref_gather_tec_movie_frame(local_1c0,"layer");
                                    if (uVar14 == 0) {
                                      if ((int)local_270 == 0) {
                                        return 0;
                                      }
                                      puts(
                                          "ERROR: inflated grid invalid, writing ref_inflate_problem.tec"
                                          );
                                      uVar14 = ref_export_tec_surf(local_1c0,
                                                                   "ref_inflate_problem.tec");
                                      if (uVar14 == 0) {
                                        pcVar25 = 
                                        "problem detected, examine ref_inflate_problem.tec";
                                        uVar22 = 0x1a8;
                                        goto LAB_0018647a;
                                      }
                                      uVar23 = (ulong)uVar14;
                                      pcVar25 = "tec";
                                      uVar22 = 0x1a7;
                                    }
                                    else {
                                      uVar23 = (ulong)uVar14;
                                      pcVar25 = "movie frame";
                                      uVar22 = 0x1a3;
                                    }
                                  }
                                  else {
                                    uVar23 = (ulong)uVar14;
                                    pcVar25 = "set new ghost node xyz";
                                    uVar22 = 0x14f;
                                  }
                                }
                                else {
                                  uVar23 = (ulong)uVar14;
                                  pcVar25 = "update ghosts";
                                  uVar22 = 0x109;
                                }
LAB_00186a6a:
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                                       ,uVar22,"ref_inflate_face",uVar23,pcVar25);
                                return (REF_STATUS)uVar23;
                              }
                              pcVar25 = "malloc o2g of REF_GLOB NULL";
                              uStackY_2b0 = 0x101;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_001860d4;
                  }
                  uVar23 = (ulong)uVar14;
                  pcVar25 = "bcast";
                  uVar22 = 0x97;
                }
                else {
                  uVar23 = (ulong)uVar14;
                  pcVar25 = "max thresh";
                  uVar22 = 0x96;
                }
              }
              else {
                uVar23 = (ulong)uVar14;
                pcVar25 = "bcast";
                uVar22 = 0x94;
              }
            }
            else {
              uVar23 = (ulong)uVar14;
              pcVar25 = "max thresh";
              uVar22 = 0x93;
            }
LAB_00186213:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c"
                   ,uVar22,"ref_inflate_face",uVar23,pcVar25);
            return (REF_STATUS)uVar23;
          }
          pcVar25 = "malloc orient of REF_DBL NULL";
          uStackY_2b0 = 0x79;
        }
      }
LAB_001860d4:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",
             uStackY_2b0,"ref_inflate_face",pcVar25);
      return 2;
    }
    pcVar25 = "malloc face_normal of REF_DBL NULL";
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_inflate.c",0x73,
         "ref_inflate_face",pcVar25);
  return RVar12;
}

Assistant:

REF_FCN REF_STATUS ref_inflate_face(REF_GRID ref_grid, REF_DICT faceids,
                                    REF_DBL *origin, REF_DBL thickness,
                                    REF_DBL xshift) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL qua = ref_grid_qua(ref_grid);
  REF_CELL pri = ref_grid_pri(ref_grid);
  REF_INT cell, tri_side, node0, node1;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT new_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ntri, tris[2], nquad, quads[2];
  REF_INT tri_node;
  REF_INT *o2n, o2n_max;
  REF_GLOB *o2g;
  REF_GLOB global;
  REF_INT new_node, node;
  REF_INT new_cell;
  REF_DBL min_dot;

  REF_DBL normal[3], dot;
  REF_INT ref_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, ref;

  REF_DBL *ymin, *ymax, dy, y0, y1, temp;
  REF_DBL *orient;
  REF_DBL *tmin, *tmax;
  REF_INT *imin, *imax;
  REF_DBL *face_normal;
  REF_INT i;
  REF_DBL theta;

  REF_BOOL problem_detected = REF_FALSE;

  REF_BOOL debug = REF_FALSE;
  REF_BOOL verbose = REF_FALSE;

  ref_malloc_init(face_normal, 3 * ref_dict_n(faceids), REF_DBL, -1.0);

  /* determine each faceids normal, only needed if my part has a tri */

  ref_malloc_init(ymin, ref_dict_n(faceids), REF_DBL, REF_DBL_MAX);
  ref_malloc_init(ymax, ref_dict_n(faceids), REF_DBL, -REF_DBL_MAX);
  ref_malloc_init(orient, ref_dict_n(faceids), REF_DBL, 1);

  y0 = REF_DBL_MAX;
  y1 = -REF_DBL_MAX;
  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_node = 0; tri_node < 3; tri_node++) {
        RSS(ref_dict_location(faceids, nodes[3], &i), "key loc");
        node = nodes[tri_node];
        dy = ref_node_xyz(ref_node, 1, node) - origin[1];
        if (ymin[i] > dy) {
          ymin[i] = dy;
        }
        if (ymax[i] < dy) {
          ymax[i] = dy;
        }
        if (y0 > dy) {
          y0 = dy;
        }
        if (y1 < dy) {
          y1 = dy;
        }
      }
    }
  }
  temp = y0;
  RSS(ref_mpi_min(ref_mpi, &temp, &y0, REF_DBL_TYPE), "max thresh");
  RSS(ref_mpi_bcast(ref_mpi, &y0, 1, REF_DBL_TYPE), "bcast");
  temp = y1;
  RSS(ref_mpi_max(ref_mpi, &temp, &y1, REF_DBL_TYPE), "max thresh");
  RSS(ref_mpi_bcast(ref_mpi, &y1, 1, REF_DBL_TYPE), "bcast");

  if (verbose) printf("y %f %f\n", y0, y1);
  each_ref_dict_key_index(faceids, i) {
    temp = ymin[i];
    RSS(ref_mpi_min(ref_mpi, &temp, &(ymin[i]), REF_DBL_TYPE), "max thresh");
    RSS(ref_mpi_bcast(ref_mpi, &(ymin[i]), 1, REF_DBL_TYPE), "bcast");
    temp = ymax[i];
    RSS(ref_mpi_max(ref_mpi, &temp, &(ymax[i]), REF_DBL_TYPE), "max thresh");
    RSS(ref_mpi_bcast(ref_mpi, &(ymax[i]), 1, REF_DBL_TYPE), "bcast");
    if (y1 - ymax[i] > ymin[i] - y0) {
      orient[i] = -1.0;
    } else {
      orient[i] = 1.0;
    }
    if (verbose) printf("%d z %f %f o %f\n", i, ymin[i], ymax[i], orient[i]);
  }

  ref_malloc_init(tmin, ref_dict_n(faceids), REF_DBL, 4.0 * ref_math_pi);
  ref_malloc_init(tmax, ref_dict_n(faceids), REF_DBL, -4.0 * ref_math_pi);
  ref_malloc_init(imin, ref_dict_n(faceids), REF_INT, REF_EMPTY);
  ref_malloc_init(imax, ref_dict_n(faceids), REF_INT, REF_EMPTY);

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3]))
      for (tri_node = 0; tri_node < 3; tri_node++) {
        RSS(ref_dict_location(faceids, nodes[3], &i), "key loc");
        node = nodes[tri_node];
        theta =
            atan2((ref_node_xyz(ref_node, 2, node) - origin[2]),
                  orient[i] * (ref_node_xyz(ref_node, 1, node) - origin[1]));

        if (tmin[i] > theta) {
          tmin[i] = theta;
          imin[i] = node;
        }
        if (tmax[i] < theta) {
          tmax[i] = theta;
          imax[i] = node;
        }
      }
  }

  if (debug) ref_dict_inspect(faceids);

  each_ref_dict_key_index(faceids, i) {
    if (!ref_mpi_para(ref_mpi)) {
      RUB(REF_EMPTY, imin[i], "imin",
          { printf("empty %d: %d \n", i, ref_dict_key(faceids, i)); });
      RUB(REF_EMPTY, imax[i], "imax",
          { printf("empty %d: %d \n", i, ref_dict_key(faceids, i)); });
    }
    if (REF_EMPTY != imin[i] && REF_EMPTY != imax[i]) {
      face_normal[0 + 3 * i] = 0.0;
      face_normal[1 + 3 * i] = (ref_node_xyz(ref_node, 2, imax[i]) -
                                ref_node_xyz(ref_node, 2, imin[i]));
      face_normal[2 + 3 * i] = -(ref_node_xyz(ref_node, 1, imax[i]) -
                                 ref_node_xyz(ref_node, 1, imin[i]));
      face_normal[1 + 3 * i] *= -orient[i];
      face_normal[2 + 3 * i] *= -orient[i];
      if (debug)
        printf("n=(%f,%f,%f)\n", face_normal[0 + 3 * i], face_normal[1 + 3 * i],
               face_normal[2 + 3 * i]);
      RSS(ref_math_normalize(&(face_normal[3 * i])), "make face norm");
      if (verbose && ref_mpi_once(ref_mpi))
        printf(
            "f=%5d n=(%7.4f,%7.4f,%7.4f) t=(%7.4f,%7.4f) angle %7.4f"
            " or %4.1f\n",
            ref_dict_key(faceids, i), face_normal[0 + 3 * i],
            face_normal[1 + 3 * i], face_normal[2 + 3 * i], tmin[i], tmax[i],
            ABS(tmin[i] - tmax[i]), orient[i]);
    }
  }

  ref_free(imax);
  ref_free(imin);
  ref_free(tmax);
  ref_free(tmin);

  ref_free(orient);

  ref_free(ymax);
  ref_free(ymin);

  o2n_max = ref_node_max(ref_node);
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  /* build list of node globals */
  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_node = 0; tri_node < 3; tri_node++) {
        node = nodes[tri_node];
        if (ref_node_owned(ref_node, node) && REF_EMPTY == o2n[node]) {
          RSS(ref_node_next_global(ref_node, &global), "global");
          RSS(ref_node_add(ref_node, global, &new_node), "add node");
          /* redundant */
          ref_node_part(ref_node, new_node) = ref_mpi_rank(ref_mpi);
          o2n[node] = new_node;
        }
      }
    }
  }

  /* sync globals */
  RSS(ref_node_shift_new_globals(ref_node), "shift glob");

  ref_malloc_init(o2g, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  /* fill ghost node globals */
  for (node = 0; node < o2n_max; node++) {
    if (REF_EMPTY != o2n[node]) {
      o2g[node] = ref_node_global(ref_node, o2n[node]);
    }
  }
  RSS(ref_node_ghost_glob(ref_node, o2g, 1), "update ghosts");

  ref_free(o2n);
  o2n_max = ref_node_max(ref_node);
  ref_malloc_init(o2n, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  for (node = 0; node < o2n_max; node++) {
    if (REF_EMPTY != o2g[node]) {
      /* returns node if already added */
      RSS(ref_node_add(ref_node, o2g[node], &new_node), "add node");
      ref_node_part(ref_node, new_node) = ref_node_part(ref_node, node);
      o2n[node] = new_node;
    }
  }

  /* create offsets */
  for (node = 0; node < o2n_max; node++) {
    if (ref_node_valid(ref_node, node)) {
      if (ref_node_owned(ref_node, node) && REF_EMPTY != o2n[node]) {
        new_node = o2n[node];
        normal[0] = 0.0;
        normal[1] = ref_node_xyz(ref_node, 1, node) - origin[1];
        normal[2] = ref_node_xyz(ref_node, 2, node) - origin[2];
        RSS(ref_math_normalize(normal), "make norm");
        each_ref_cell_having_node(tri, node, item, ref) {
          RSS(ref_cell_nodes(tri, ref, ref_nodes), "cell");
          if (!ref_dict_has_key(faceids, ref_nodes[3])) continue;
          RSS(ref_dict_location(faceids, ref_nodes[3], &i), "key loc");
          dot = -ref_math_dot(normal, &(face_normal[3 * i]));
          RAS(face_normal[0 + 3 * i] > -0.1, "uninitialized face_normal");
          if (dot < 0.70 || dot > 1.01) {
            printf("out-of-range dot %.15f at %f %f %f\n", dot,
                   ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            problem_detected = REF_TRUE;
          }
          RAB(ref_math_divisible(normal[1], dot), "normal[1] /= dot", {
            printf("dot %e\n", dot);
            printf(" xyz %f %f %f\n", ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            printf(" norm %f %f %f\n", normal[0], normal[1], normal[2]);
            printf("%d face norm %f %f %f\n", i, face_normal[0 + 3 * i],
                   face_normal[1 + 3 * i], face_normal[2 + 3 * i]);
          });
          RAB(ref_math_divisible(normal[2], dot), "normal[2] /= dot", {
            printf("dot %e\n", dot);
            printf(" xyz %f %f %f\n", ref_node_xyz(ref_node, 0, node),
                   ref_node_xyz(ref_node, 1, node),
                   ref_node_xyz(ref_node, 2, node));
            printf(" norm %f %f %f\n", normal[0], normal[1], normal[2]);
            printf("%d face norm %f %f %f\n", i, face_normal[0 + 3 * i],
                   face_normal[1 + 3 * i], face_normal[2 + 3 * i]);
          });
          normal[1] /= dot;
          normal[2] /= dot;
        }
        ref_node_xyz(ref_node, 0, new_node) =
            xshift + ref_node_xyz(ref_node, 0, node);
        ref_node_xyz(ref_node, 1, new_node) =
            thickness * normal[1] + ref_node_xyz(ref_node, 1, node);
        ref_node_xyz(ref_node, 2, new_node) =
            thickness * normal[2] + ref_node_xyz(ref_node, 2, node);
      }
    }
  }

  if (problem_detected) printf("ERROR: new node normal\n");

  RSS(ref_node_ghost_real(ref_node), "set new ghost node xyz");

  ref_free(face_normal);

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      for (tri_side = 0; tri_side < 3; tri_side++) {
        node0 = ref_cell_e2n(tri, 0, tri_side, cell);
        node1 = ref_cell_e2n(tri, 1, tri_side, cell);
        if (ref_node_owned(ref_node, node0) ||
            ref_node_owned(ref_node, node1)) {
          RSS(ref_cell_list_with2(tri, node0, node1, 2, &ntri, tris),
              "bad tri count");
          if (1 == ntri) {
            RSS(ref_cell_list_with2(qua, node0, node1, 2, &nquad, quads),
                "bad quad count");
            REIS(1, nquad, "tri without quad");
            new_nodes[4] = ref_cell_c2n(qua, 4, quads[0]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
          if (ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[0])) &&
              !ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[1]))) {
            new_nodes[4] = ref_cell_c2n(tri, 3, tris[1]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
          if (!ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[0])) &&
              ref_dict_has_key(faceids, ref_cell_c2n(tri, 3, tris[1]))) {
            new_nodes[4] = ref_cell_c2n(tri, 3, tris[0]);
            new_nodes[0] = node0;
            new_nodes[1] = node1;
            new_nodes[2] = o2n[node1];
            new_nodes[3] = o2n[node0];
            RSS(ref_cell_add(qua, new_nodes, &new_cell), "qua tri1");
            continue;
          }
        }
      }
    }
  }

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      new_nodes[0] = nodes[0];
      new_nodes[1] = nodes[2];
      new_nodes[2] = nodes[1];
      new_nodes[3] = o2n[nodes[0]];
      new_nodes[4] = o2n[nodes[2]];
      new_nodes[5] = o2n[nodes[1]];

      RSS(ref_inflate_pri_min_dot(ref_node, new_nodes, &min_dot), "md");
      if (min_dot <= 0.0) {
        printf("min_dot %f near %f %f %f\n", min_dot,
               ref_node_xyz(ref_node, 0, nodes[0]),
               ref_node_xyz(ref_node, 1, nodes[0]),
               ref_node_xyz(ref_node, 2, nodes[0]));
        problem_detected = REF_TRUE;
      }

      RSS(ref_cell_add(pri, new_nodes, &new_cell), "pri");
    }
  }

  each_ref_cell_valid_cell_with_nodes(tri, cell, nodes) {
    if (ref_dict_has_key(faceids, nodes[3])) {
      nodes[0] = o2n[nodes[0]];
      nodes[1] = o2n[nodes[1]];
      nodes[2] = o2n[nodes[2]];
      RSS(ref_cell_replace_whole(tri, cell, nodes), "repl");
    }
  }

  ref_free(o2g);
  ref_free(o2n);

  ref_gather_blocking_frame(ref_grid, "layer");

  if (problem_detected) {
    printf("ERROR: inflated grid invalid, writing ref_inflate_problem.tec\n");
    RSS(ref_export_tec_surf(ref_grid, "ref_inflate_problem.tec"), "tec");
    THROW("problem detected, examine ref_inflate_problem.tec");
  }

  return REF_SUCCESS;
}